

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefAs
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefAs *curr)

{
  RefAsOp RVar1;
  bool bVar2;
  Literal *pLVar3;
  Literal *this_00;
  undefined1 local_b8 [8];
  Flow flow;
  Literal local_58;
  Literal local_40;
  
  visit((Flow *)local_b8,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar3 = Flow::getSingleValue((Flow *)local_b8);
    RVar1 = curr->op;
    if (RVar1 == RefAsNonNull) {
      bVar2 = Type::isNull(&pLVar3->type);
      if (bVar2) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      this_00 = (Literal *)&flow.breakTo.super_IString.str._M_str;
      ::wasm::Literal::Literal(this_00,pLVar3);
      Flow::Flow(__return_storage_ptr__,this_00);
    }
    else if (RVar1 == AnyConvertExtern) {
      this_00 = &local_58;
      ::wasm::Literal::internalize();
      Flow::Flow(__return_storage_ptr__,this_00);
    }
    else {
      if (RVar1 != ExternConvertAny) {
        ::wasm::handle_unreachable
                  ("unimplemented ref.as_*",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x82e);
      }
      this_00 = &local_40;
      ::wasm::Literal::externalize();
      Flow::Flow(__return_storage_ptr__,this_00);
    }
    ::wasm::Literal::~Literal(this_00);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_b8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefAs(RefAs* curr) {
    NOTE_ENTER("RefAs");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case RefAsNonNull:
        if (value.isNull()) {
          trap("null ref");
        }
        return value;
      case AnyConvertExtern:
        return value.internalize();
      case ExternConvertAny:
        return value.externalize();
    }
    WASM_UNREACHABLE("unimplemented ref.as_*");
  }